

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O2

void __thiscall Timing::Save(Timing *this,string *filename)

{
  ostream *poVar1;
  E *this_00;
  string sStack_3c8;
  stringstream ss;
  ostream local_398 [376];
  ofstream fp;
  byte abStack_200 [480];
  
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_200[*(long *)(_fp + -0x18)] & 5) == 0) {
    Save(this,&fp);
    std::ofstream::~ofstream(&fp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_398,"Timing::Save: failed to open file ");
  std::operator<<(poVar1,(string *)filename);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_00,&sStack_3c8);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void Timing::Save(const string & filename) const
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "Timing::Save: failed to open file " << filename;
        throw(E(ss.str()));
    }

    Save(fp);
}